

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::valid_property
          (rules_holder<cppcms::xss::compare_c_string,_true> *this,c_string *tname,c_string *pname,
          c_string *value)

{
  bool bVar1;
  char *__args_1;
  c_string *in_RCX;
  char *in_RDI;
  compare_c_string cmp;
  const_iterator pp;
  const_iterator pt;
  c_string *in_stack_ffffffffffffff98;
  function<bool_(const_char_*,_const_char_*)> *in_stack_ffffffffffffffa0;
  function<bool_(const_char_*,_const_char_*)> *in_stack_ffffffffffffffb0;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  c_string *local_28;
  bool local_1;
  
  local_28 = in_RCX;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
       ::find((map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
               *)in_stack_ffffffffffffff98,(key_type *)0x461180);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
       ::end((map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
              *)in_stack_ffffffffffffff98);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>
                  *)0x4611c1);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
         ::find((map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                 *)in_stack_ffffffffffffff98,(key_type *)0x4611d2);
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>
                  *)0x4611e1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
         ::end((map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                *)in_stack_ffffffffffffff98);
    bVar1 = std::operator==(&local_40,&local_48);
    if (bVar1) {
      local_1 = false;
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
                    *)0x46121b);
      bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        bVar1 = compare_c_string::operator()
                          ((compare_c_string *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           (c_string *)0x461245);
        if ((!bVar1) &&
           (bVar1 = compare_c_string::operator()
                              ((compare_c_string *)in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff98,(c_string *)0x46125d), !bVar1)) {
          return true;
        }
        local_1 = false;
      }
      else {
        std::
        _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
                      *)0x461279);
        __args_1 = details::c_string::begin(local_28);
        details::c_string::end(local_28);
        bVar1 = std::function<bool_(const_char_*,_const_char_*)>::operator()
                          (in_stack_ffffffffffffffb0,in_RDI,__args_1);
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool valid_property(c_string const &tname,c_string const &pname,c_string const &value) const
		{
			typename tags_type::const_iterator pt = tags.find(tname);
			if(pt==tags.end())
				return false;
			typename properties_type::const_iterator pp = pt->second.properties.find(pname);
			if(pp == pt->second.properties.end())
				return false;
			if(pp->second == nullptr) {
				if(IsXHTML) {
					Comp cmp;
					if(!cmp(pname,value) && !cmp(value,pname))
						return true;
					return false;
				}
				else {
					return false; // Should be boolean in HTML
				}
			}
			if(pp->second(value.begin(),value.end()))
				return true;
			return false;
		}